

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnBrOnExn(TypeChecker *this,Index depth,TypeVector *types)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  char *prefix;
  TypeVector *expected;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  Label *label;
  Label *local_78;
  string local_70;
  string local_50;
  
  RVar2 = PopAndCheck1Type(this,(Type)0xffffffe8,"br_on_exn");
  this_00 = this;
  RVar3 = GetLabel(this,depth,&local_78);
  prefix = (char *)(ulong)RVar3.enum_;
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    expected = &local_78->result_types;
    if (local_78->label_type == Loop) {
      expected = &local_78->param_types;
    }
    RVar3 = CheckTypes(this_00,types,expected);
    if (RVar3.enum_ == Error) {
      this_01 = (_anonymous_namespace_ *)&local_78->result_types;
      if (local_78->label_type == Loop) {
        this_01 = (_anonymous_namespace_ *)&local_78->param_types;
      }
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_50,this_01,(TypeVector *)0x0,prefix);
      _Var1._M_p = local_50._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)types,(TypeVector *)0x0,prefix);
      PrintError(this,"br_on_exn has inconsistent types: expected %s, got %s",_Var1._M_p,
                 local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      RVar2.enum_ = Error;
    }
    PushType(this,(Type)0xffffffe8);
    EVar4 = RVar2.enum_;
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnBrOnExn(Index depth, const TypeVector& types) {
  Result result = PopAndCheck1Type(Type::ExnRef, "br_on_exn");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  if (Failed(CheckTypes(types, label->br_types()))) {
    PrintError("br_on_exn has inconsistent types: expected %s, got %s",
               TypesToString(label->br_types()).c_str(),
               TypesToString(types).c_str());
    result = Result::Error;
  }
  PushType(Type::ExnRef);
  return result;
}